

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteObjectsStrings
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objStrings,size_type limit)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer pbVar1;
  cmOutputConverter *pcVar2;
  string *obj;
  pointer pbVar3;
  cmMakefileTargetGeneratorObjectStrings local_d0;
  cmStateSnapshot local_48;
  
  this_00 = this->LocalGenerator;
  pcVar2 = &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (this_00 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    pcVar2 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot(&local_48,(cmLocalGenerator *)this_00);
  cmStateSnapshot::GetDirectory(&local_d0.StateDir,&local_48);
  local_d0.CurrentString._M_dataplus._M_p = (pointer)&local_d0.CurrentString.field_2;
  local_d0.CurrentString._M_string_length = 0;
  local_d0.CurrentString.field_2._M_local_buf[0] = '\0';
  local_d0.NextObject._M_dataplus._M_p = (pointer)&local_d0.NextObject.field_2;
  local_d0.NextObject._M_string_length = 0;
  local_d0.NextObject.field_2._M_local_buf[0] = '\0';
  local_d0.Space = "";
  pbVar1 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_d0.Strings = objStrings;
  local_d0.OutputConverter = pcVar2;
  local_d0.LengthLimit = limit;
  for (pbVar3 = (this->Objects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    cmMakefileTargetGeneratorObjectStrings::Feed(&local_d0,pbVar3);
  }
  pbVar1 = (this->ExternalObjects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->ExternalObjects).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    cmMakefileTargetGeneratorObjectStrings::Feed(&local_d0,pbVar3);
  }
  cmMakefileTargetGeneratorObjectStrings::Done(&local_d0);
  cmMakefileTargetGeneratorObjectStrings::~cmMakefileTargetGeneratorObjectStrings(&local_d0);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsStrings(
  std::vector<std::string>& objStrings, std::string::size_type limit)
{
  cmMakefileTargetGeneratorObjectStrings helper(
    objStrings, this->LocalGenerator,
    this->LocalGenerator->GetStateSnapshot().GetDirectory(), limit);
  for (std::string const& obj : this->Objects) {
    helper.Feed(obj);
  }
  for (std::string const& obj : this->ExternalObjects) {
    helper.Feed(obj);
  }
  helper.Done();
}